

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nihgui.cpp
# Opt level: O1

void __thiscall Dialog::on_mouse_axes(Dialog *this,ALLEGRO_MOUSE_EVENT *event)

{
  Widget *pWVar1;
  
  if (event->display != this->display) {
    return;
  }
  pWVar1 = this->mouse_down_widget;
  if (pWVar1 != (Widget *)0x0) {
    (*pWVar1->_vptr_Widget[7])
              (pWVar1,(ulong)(uint)event->x,(ulong)(uint)event->y,pWVar1->_vptr_Widget[7]);
    return;
  }
  check_mouse_over(this,event->x,event->y);
  return;
}

Assistant:

void Dialog::on_mouse_axes(const ALLEGRO_MOUSE_EVENT & event)
{
   const int mx = event.x;
   const int my = event.y;

   if (event.display != this->display) {
      return;
   }

   if (this->mouse_down_widget) {
      this->mouse_down_widget->on_mouse_button_hold(mx, my);
      return;
   }

   this->check_mouse_over(mx, my);
}